

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRex.c
# Opt level: O0

Gia_Man_t * Gia_ManRex2Gia(char *pStrInit,int fOrder,int fVerbose)

{
  Gia_Man_t *pGVar1;
  int nSize;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pStr_00;
  size_t sVar6;
  char *pcVar7;
  Vec_Int_t *p;
  Vec_Int_t *vStaTrans_00;
  Vec_Int_t *p_00;
  Vec_Int_t *vVisited_00;
  Gia_Obj_t *pGVar8;
  Vec_Str_t *p_01;
  int iInputLit;
  int iThisLit;
  int iThat;
  int iThis;
  int Or;
  int Lp;
  int nTravId;
  int nLength;
  int Entry;
  int iLit;
  int k;
  int i;
  int nStates;
  char *pStr;
  Vec_Str_t *vInit;
  Vec_Int_t *vVisited;
  Vec_Int_t *vStack;
  Vec_Int_t *vStaTrans;
  Vec_Int_t *vStaLits;
  Vec_Int_t *vStr2Sta;
  Vec_Int_t *vAlphas;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  int fVerbose_local;
  int fOrder_local;
  char *pStrInit_local;
  
  pTemp = (Gia_Man_t *)0x0;
  pNew._0_4_ = fVerbose;
  pNew._4_4_ = fOrder;
  _fVerbose_local = pStrInit;
  pStr_00 = Gia_ManRexPreprocess(pStrInit);
  nSize = Gia_ManRexNumInputs(pStr_00,&vStr2Sta,&vStaLits);
  sVar6 = strlen(pStr_00);
  iVar5 = (int)sVar6;
  Or = 1;
  if (pNew._4_4_ != 0) {
    Vec_IntSort(vStr2Sta,0);
  }
  printf("Input variable order: ");
  for (Entry = 0; iVar2 = Vec_IntSize(vStr2Sta), Entry < iVar2; Entry = Entry + 1) {
    iVar2 = Vec_IntEntry(vStr2Sta,Entry);
    printf("%c",(ulong)(uint)(int)(char)iVar2);
  }
  printf("\n");
  pTemp = Gia_ManStart(1000);
  pcVar7 = Abc_UtilStrsav(_fVerbose_local);
  pTemp->pName = pcVar7;
  for (iLit = 0; iVar2 = Vec_IntSize(vStr2Sta), iLit < iVar2 + nSize; iLit = iLit + 1) {
    Gia_ManAppendCi(pTemp);
  }
  p = Vec_IntStart(nSize + 1);
  vStaTrans_00 = Vec_IntStartFull(iVar5);
  p_00 = Vec_IntAlloc(iVar5);
  vVisited_00 = Vec_IntStartFull(iVar5 + 1);
  for (iLit = 0; iLit < iVar5; iLit = iLit + 1) {
    iThis = iLit;
    if ((pStr_00[iLit] == '(') || (pStr_00[iLit] == '|')) {
      Vec_IntPush(p_00,iLit);
    }
    else if ((pStr_00[iLit] == ')') && (iThis = Vec_IntPop(p_00), pStr_00[iThis] == '|')) {
      iVar2 = Vec_IntPop(p_00);
      Vec_IntWriteEntry(vStaTrans_00,iVar2,iThis + 1);
      Vec_IntWriteEntry(vStaTrans_00,iThis,iLit);
      iThis = iVar2;
    }
    if ((iLit < iVar5 + -1) && (pStr_00[iLit + 1] == '*')) {
      Vec_IntWriteEntry(vStaTrans_00,iThis,iLit + 1);
      Vec_IntWriteEntry(vStaTrans_00,iLit + 1,iThis);
    }
  }
  iVar2 = Vec_IntSize(p_00);
  if (iVar2 == 0) {
    if ((int)pNew != 0) {
      Gia_ManPrintAutom(pStr_00,vStaTrans_00);
    }
    Gia_ManHashAlloc(pTemp);
    for (iLit = 1; iLit < iVar5; iLit = iLit + 1) {
      iVar2 = Gia_SymbSpecial(pStr_00[iLit]);
      if (iVar2 == 0) {
        iVar2 = Or + 1;
        Gia_ManCollectReached(pStr_00,vStaTrans_00,iLit,p_00,vVisited_00,Or);
        if ((int)pNew != 0) {
          Gia_ManPrintReached(pStr_00,iLit,p_00);
        }
        iVar3 = Vec_IntEntry(vStaLits,iLit);
        pGVar1 = pTemp;
        iVar4 = Vec_IntSize(vStr2Sta);
        pGVar8 = Gia_ManPi(pGVar1,iVar4 + iVar3);
        iVar3 = Gia_Obj2Lit(pGVar1,pGVar8);
        pGVar1 = pTemp;
        iVar4 = Vec_IntFind(vStr2Sta,(int)pStr_00[iLit]);
        pGVar8 = Gia_ManPi(pGVar1,iVar4);
        iVar4 = Gia_Obj2Lit(pGVar1,pGVar8);
        nLength = Gia_ManHashAnd(pTemp,iVar3,iVar4);
        for (Entry = 0; iVar3 = Vec_IntSize(p_00), Or = iVar2, Entry < iVar3; Entry = Entry + 1) {
          iVar3 = Vec_IntEntry(p_00,Entry);
          iVar3 = Vec_IntEntry(vStaLits,iVar3);
          pGVar1 = pTemp;
          iVar4 = Vec_IntEntry(p,iVar3);
          nLength = Gia_ManHashOr(pGVar1,nLength,iVar4);
          Vec_IntWriteEntry(p,iVar3,nLength);
        }
      }
    }
    Vec_IntClear(p_00);
    for (iLit = 0; iVar5 = Vec_IntSize(vStr2Sta), pGVar1 = pTemp, iLit < iVar5; iLit = iLit + 1) {
      pGVar8 = Gia_ManPi(pTemp,iLit);
      iVar5 = Gia_Obj2Lit(pGVar1,pGVar8);
      Vec_IntPush(p_00,iVar5);
    }
    iVar5 = Gia_ManBuild1Hot(pTemp,p_00);
    for (Entry = 0; iVar2 = Vec_IntSize(p), Entry < iVar2; Entry = Entry + 1) {
      iVar2 = Vec_IntEntry(p,Entry);
      iVar2 = Gia_ManHashAnd(pTemp,iVar5,iVar2);
      Vec_IntWriteEntry(p,Entry,iVar2);
    }
    Gia_ManHashStop(pTemp);
    Gia_ManCollectReached(pStr_00,vStaTrans_00,0,p_00,vVisited_00,Or);
    if ((int)pNew != 0) {
      Gia_ManPrintReached(pStr_00,0,p_00);
    }
    p_01 = Vec_StrStart(nSize + 1);
    Vec_StrFill(p_01,nSize,'0');
    for (Entry = 0; iVar5 = Vec_IntSize(p_00), Entry < iVar5; Entry = Entry + 1) {
      iVar5 = Vec_IntEntry(p_00,Entry);
      if (pStr_00[iVar5] != '\0') {
        iVar5 = Vec_IntEntry(vStaLits,iVar5);
        Vec_StrWriteEntry(p_01,iVar5,'1');
      }
    }
    if ((int)pNew != 0) {
      pcVar7 = Vec_StrArray(p_01);
      printf("Init state = %s\n",pcVar7);
    }
    iVar5 = Vec_IntPop(p);
    Vec_IntPushFirst(p,iVar5);
    iVar5 = Vec_IntSize(p);
    if (iVar5 == nSize + 1) {
      for (iLit = 0; iVar5 = Vec_IntSize(p), iLit < iVar5; iLit = iLit + 1) {
        iVar5 = Vec_IntEntry(p,iLit);
        Gia_ManAppendCo(pTemp,iVar5);
      }
      Gia_ManSetRegNum(pTemp,nSize);
      vAlphas = (Vec_Int_t *)pTemp;
      pTemp = Gia_ManCleanup(pTemp);
      Gia_ManStop((Gia_Man_t *)vAlphas);
      pGVar1 = pTemp;
      vAlphas = (Vec_Int_t *)pTemp;
      pcVar7 = Vec_StrArray(p_01);
      pTemp = Gia_ManDupZeroUndc(pGVar1,pcVar7,0,0,0);
      Gia_ManStop((Gia_Man_t *)vAlphas);
      Vec_StrFree(p_01);
      Vec_IntFree(vStr2Sta);
      Vec_IntFree(vStaLits);
      Vec_IntFree(p);
      Vec_IntFree(vStaTrans_00);
      Vec_IntFree(p_00);
      Vec_IntFree(vVisited_00);
      if (pStr_00 != (char *)0x0) {
        free(pStr_00);
      }
      return pTemp;
    }
    __assert_fail("Vec_IntSize(vStaLits) == nStates + 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaRex.c"
                  ,0x130,"Gia_Man_t *Gia_ManRex2Gia(char *, int, int)");
  }
  __assert_fail("Vec_IntSize(vStack) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaRex.c"
                ,0xfe,"Gia_Man_t *Gia_ManRex2Gia(char *, int, int)");
}

Assistant:

Gia_Man_t * Gia_ManRex2Gia( char * pStrInit, int fOrder, int fVerbose )
{
    Gia_Man_t * pNew = NULL, * pTemp; 
    Vec_Int_t * vAlphas, * vStr2Sta, * vStaLits;
    Vec_Int_t * vStaTrans, * vStack, * vVisited;
    Vec_Str_t * vInit;
    char * pStr = Gia_ManRexPreprocess( pStrInit );
    int nStates = Gia_ManRexNumInputs( pStr, &vAlphas, &vStr2Sta );
    int i, k, iLit, Entry, nLength = strlen(pStr), nTravId = 1;
    if ( fOrder )
        Vec_IntSort( vAlphas, 0 );
//    if ( fVerbose )
    {
        printf( "Input variable order: " );
        Vec_IntForEachEntry( vAlphas, Entry, k )
            printf( "%c", (char)Entry );
        printf( "\n" );
    }
    // start AIG
    pNew = Gia_ManStart( 1000 );
    pNew->pName = Abc_UtilStrsav( pStrInit );
    for ( i = 0; i < Vec_IntSize(vAlphas) + nStates; i++ )
        Gia_ManAppendCi( pNew );
    // prepare automaton
    vStaLits  = Vec_IntStart( nStates + 1 );
    vStaTrans = Vec_IntStartFull( nLength );
    vStack    = Vec_IntAlloc( nLength );
    vVisited  = Vec_IntStartFull( nLength + 1 );
    for ( i = 0; i < nLength; i++ )
    {
        int Lp = i;
        if ( pStr[i] == '(' || pStr[i] == '|' )
            Vec_IntPush( vStack, i );
        else if ( pStr[i] == ')' )
        {
            int Or = Vec_IntPop( vStack );
            if ( pStr[Or] == '|' )
            {
                Lp = Vec_IntPop( vStack );
                Vec_IntWriteEntry( vStaTrans, Lp, Or + 1 );
                Vec_IntWriteEntry( vStaTrans, Or, i );
            }
            else
                Lp = Or;
        }
        if ( i < nLength - 1 && pStr[i+1] == '*' )
        {
            Vec_IntWriteEntry( vStaTrans, Lp, i+1 );
            Vec_IntWriteEntry( vStaTrans, i+1, Lp );
        }
    }
    assert( Vec_IntSize(vStack) == 0 );
    if ( fVerbose )
        Gia_ManPrintAutom( pStr, vStaTrans );

    // create next-state functions for each state
    Gia_ManHashAlloc( pNew );
    for ( i = 1; i < nLength; i++ )
    {
        int iThis, iThat, iThisLit, iInputLit;
        if ( Gia_SymbSpecial(pStr[i]) )
            continue;
        Gia_ManCollectReached( pStr, vStaTrans, i, vStack, vVisited, nTravId++ );
        if ( fVerbose )
            Gia_ManPrintReached( pStr, i, vStack );
        // create transitions from this state under this input
        iThis = Vec_IntEntry(vStr2Sta, i);
        iThisLit = Gia_Obj2Lit(pNew, Gia_ManPi(pNew, Vec_IntSize(vAlphas) + iThis));
        iInputLit = Gia_Obj2Lit(pNew, Gia_ManPi(pNew, Vec_IntFind(vAlphas, pStr[i])));
        iLit = Gia_ManHashAnd( pNew, iThisLit, iInputLit );
        Vec_IntForEachEntry( vStack, Entry, k )
        {
            iThat = Vec_IntEntry(vStr2Sta, Entry);
            iLit = Gia_ManHashOr( pNew, iLit, Vec_IntEntry(vStaLits, iThat) );
            Vec_IntWriteEntry( vStaLits, iThat, iLit );
        }
    }
    // create one-hotness
    Vec_IntClear( vStack );
    for ( i = 0; i < Vec_IntSize(vAlphas); i++ )
        Vec_IntPush( vStack, Gia_Obj2Lit(pNew, Gia_ManPi(pNew, i)) );
    iLit = Gia_ManBuild1Hot( pNew, vStack );
    // combine with outputs
    Vec_IntForEachEntry( vStaLits, Entry, k )
        Vec_IntWriteEntry( vStaLits, k, Gia_ManHashAnd(pNew, iLit, Entry) );
    Gia_ManHashStop( pNew );

    // collect initial state
    Gia_ManCollectReached( pStr, vStaTrans, 0, vStack, vVisited, nTravId++ );
    if ( fVerbose )
        Gia_ManPrintReached( pStr, 0, vStack );
    vInit = Vec_StrStart( nStates + 1 );
    Vec_StrFill( vInit, nStates, '0' );
    Vec_IntForEachEntry( vStack, Entry, k )
        if ( pStr[Entry] != '\0' )
            Vec_StrWriteEntry( vInit, Vec_IntEntry(vStr2Sta, Entry), '1' );
    if ( fVerbose )
        printf( "Init state = %s\n", Vec_StrArray(vInit) );

    // add outputs
    Vec_IntPushFirst( vStaLits, Vec_IntPop(vStaLits) );
    assert( Vec_IntSize(vStaLits) == nStates + 1 );
    Vec_IntForEachEntry( vStaLits, iLit, i )
        Gia_ManAppendCo( pNew, iLit );
    Gia_ManSetRegNum( pNew, nStates );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );

    // add initial state
    pNew = Gia_ManDupZeroUndc( pTemp = pNew, Vec_StrArray(vInit), 0, 0, 0 );
    Gia_ManStop( pTemp );
    Vec_StrFree( vInit );
/*
    Gia_ManAutomSimulate( pNew, vAlphas, "0" );
    Gia_ManAutomSimulate( pNew, vAlphas, "01" );
    Gia_ManAutomSimulate( pNew, vAlphas, "110" );
    Gia_ManAutomSimulate( pNew, vAlphas, "011" );
    Gia_ManAutomSimulate( pNew, vAlphas, "111" );
    Gia_ManAutomSimulate( pNew, vAlphas, "1111" );
    Gia_ManAutomSimulate( pNew, vAlphas, "1010" );

    Gia_ManAutomSimulate( pNew, vAlphas, "A" );
    Gia_ManAutomSimulate( pNew, vAlphas, "AD" );
    Gia_ManAutomSimulate( pNew, vAlphas, "ABCD" );
    Gia_ManAutomSimulate( pNew, vAlphas, "BCD" );
    Gia_ManAutomSimulate( pNew, vAlphas, "CD" );
*/

    // cleanup
    Vec_IntFree( vAlphas );
    Vec_IntFree( vStr2Sta );
    Vec_IntFree( vStaLits );
    Vec_IntFree( vStaTrans );
    Vec_IntFree( vStack );
    Vec_IntFree( vVisited );
    ABC_FREE( pStr );
    return pNew;
}